

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int pushParseTest(char *filename,char *result,char *err,int options)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  int size;
  char *base;
  uint local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  nb_tests = nb_tests + 1;
  iVar3 = loadMem(filename,&local_50,(int *)&local_54);
  pcVar6 = local_50;
  uVar1 = local_54;
  if (iVar3 == 0) {
    uVar7 = (ulong)(int)local_54;
    uVar5 = 4;
    if ((int)local_54 < 4) {
      uVar5 = (ulong)local_54;
    }
    local_48 = filename;
    local_40 = err;
    local_38 = result;
    if (((uint)options >> 0x1e & 1) == 0) {
      lVar4 = xmlCreatePushParserCtxt(0,0,local_50,uVar5,filename);
    }
    else {
      lVar4 = htmlCreatePushParserCtxt(0,0,local_50,uVar5,filename,0);
    }
    xmlCtxtSetErrorHandler(lVar4,testStructuredErrorHandler,0);
    xmlCtxtUseOptions(lVar4,options);
    if ((int)uVar5 + 0x400 < (int)uVar1) {
      uVar8 = 4;
      if ((long)uVar7 < 4) {
        uVar8 = uVar7;
      }
      do {
        uVar5 = uVar8 + 0x400;
        if (((uint)options >> 0x1e & 1) == 0) {
          xmlParseChunk();
          if ((long)uVar7 <= (long)uVar5) goto LAB_0010987a;
        }
        else {
          htmlParseChunk(lVar4,pcVar6 + uVar8,0x400,0);
          if ((long)uVar7 <= (long)uVar5) goto LAB_001098b3;
        }
        lVar9 = uVar8 + 0x800;
        uVar8 = uVar5;
      } while (lVar9 < (long)uVar7);
    }
    if (((uint)options >> 0x1e & 1) == 0) {
      xmlParseChunk();
LAB_0010987a:
      uVar10 = *(undefined8 *)(lVar4 + 0x10);
      iVar3 = *(int *)(lVar4 + 0x18);
      xmlFreeParserCtxt(lVar4);
      free(pcVar6);
      if (iVar3 == 0) {
        xmlFreeDoc(uVar10);
        pcVar6 = "Failed to parse %s\n";
        filename = local_48;
        goto LAB_001099b8;
      }
      xmlDocDumpMemory(uVar10,&local_50,&local_54);
    }
    else {
      htmlParseChunk(lVar4,pcVar6 + (int)uVar5,uVar1 - (int)uVar5,1);
LAB_001098b3:
      uVar10 = *(undefined8 *)(lVar4 + 0x10);
      xmlFreeParserCtxt(lVar4);
      free(pcVar6);
      htmlDocDumpMemory(uVar10,&local_50,&local_54);
    }
    filename = local_48;
    xmlFreeDoc(uVar10);
    pcVar2 = local_38;
    iVar3 = compareFileMem(local_38,local_50,local_54);
    pcVar6 = local_40;
    if ((local_50 == (char *)0x0) || (iVar3 != 0)) {
      if (local_50 != (char *)0x0) {
        (*_xmlFree)();
      }
      fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar2);
      return -1;
    }
    (*_xmlFree)();
    if (pcVar6 == (char *)0x0) {
      return 0;
    }
    iVar3 = compareFileMem(pcVar6,testErrors,testErrorsSize);
    if (iVar3 == 0) {
      return 0;
    }
    pcVar6 = "Error for %s failed\n";
  }
  else {
    pcVar6 = "Failed to load %s\n";
  }
LAB_001099b8:
  fprintf(_stderr,pcVar6,filename);
  return -1;
}

Assistant:

static int
pushParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base;
    int size, res;
    int cur = 0;
    int chunkSize = 4;

    nb_tests++;
    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    if (chunkSize > size)
        chunkSize = size;

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur += chunkSize;
    chunkSize = 1024;
    do {
        if (cur + chunkSize >= size) {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, size - cur, 1);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, size - cur, 1);
	    break;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    cur += chunkSize;
	}
    } while (cur < size);
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}